

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86_fma::forward_inplace
          (Scale_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [24];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  reference pvVar22;
  reference pvVar23;
  undefined8 *puVar24;
  undefined1 (*pauVar25) [24];
  undefined8 *puVar26;
  int iVar27;
  int iVar28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  __m128 _p128_5;
  __m256 _p256_5;
  int i_8;
  __m128 _p128_4;
  __m256 _p256_4;
  int i_7;
  __m256 _b256_1;
  __m128 _b128_1;
  float b_1;
  __m256 _s256_3;
  __m128 _s128_3;
  float s_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_3;
  __m256 _p256_3;
  int j_1;
  __m128 _p128_2;
  __m256 _p256_2;
  int j;
  __m256 _b256;
  __m128 _b128;
  float b;
  __m256 _s256_2;
  __m128 _s128_2;
  float s;
  float *ptr_1;
  int i_6;
  int size_1;
  int i_5;
  __m128 _s128_1;
  __m128 _p128_1;
  int i_4;
  int ii_3;
  __m256 _s256_1;
  __m256 _p256_1;
  int i_3;
  int ii_2;
  int remain_size_start_1;
  int nn_size_1;
  int i_2;
  __m128 _bias128;
  __m128 _s128;
  __m128 _p128;
  int i_1;
  int ii_1;
  __m256 _bias256;
  __m256 _s256;
  __m256 _p256;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  int size;
  float *ptr;
  float *bias;
  float *scale;
  int elempack;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m;
  undefined1 local_dc0 [32];
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined1 local_d80 [32];
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined1 local_d20 [32];
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined1 local_ce0 [32];
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  int local_c54;
  int local_c04;
  undefined1 (*local_b20) [32];
  int local_b18;
  int local_ad4;
  int local_a84;
  undefined1 (*local_a08) [32];
  int local_9fc;
  int local_9f4;
  int local_9c4;
  int local_970;
  int local_964;
  int local_924;
  int local_8b0;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_580;
  undefined8 uStack_578;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined4 uStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined4 uStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  
  pvVar22 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar23 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar21 = pvVar22->w;
  iVar3 = pvVar22->h;
  iVar4 = pvVar22->d;
  iVar5 = pvVar22->c;
  iVar6 = pvVar22->dims;
  iVar7 = pvVar22->elempack;
  pvVar8 = pvVar23->data;
  lVar9 = *(long *)(in_RDI + 0x120);
  if (iVar6 == 1) {
    pvVar10 = pvVar22->data;
    iVar27 = iVar21 * iVar7;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_970 = 0; local_970 < iVar27 / 8; local_970 = local_970 + 1) {
        iVar28 = local_970 * 8;
        pauVar25 = (undefined1 (*) [24])((long)pvVar10 + (long)iVar28 * 4);
        auVar16 = *pauVar25;
        uVar12 = *(undefined8 *)pauVar25[1];
        puVar24 = (undefined8 *)((long)pvVar8 + (long)iVar28 * 4);
        puVar26 = (undefined8 *)((long)pvVar10 + (long)iVar28 * 4);
        local_480 = auVar16._0_4_;
        fStack_47c = auVar16._4_4_;
        fStack_478 = auVar16._8_4_;
        fStack_474 = auVar16._12_4_;
        fStack_470 = auVar16._16_4_;
        fStack_46c = auVar16._20_4_;
        fStack_468 = (float)uVar12;
        uStack_464 = (undefined4)((ulong)uVar12 >> 0x20);
        local_4a0 = (float)*puVar24;
        fStack_49c = (float)((ulong)*puVar24 >> 0x20);
        fStack_498 = (float)puVar24[1];
        fStack_494 = (float)((ulong)puVar24[1] >> 0x20);
        fStack_490 = (float)puVar24[2];
        fStack_48c = (float)((ulong)puVar24[2] >> 0x20);
        fStack_488 = (float)puVar24[3];
        *puVar26 = CONCAT44(fStack_47c * fStack_49c,local_480 * local_4a0);
        puVar26[1] = CONCAT44(fStack_474 * fStack_494,fStack_478 * fStack_498);
        puVar26[2] = CONCAT44(fStack_46c * fStack_48c,fStack_470 * fStack_490);
        puVar26[3] = CONCAT44(uStack_464,fStack_468 * fStack_488);
      }
      local_9f4 = (iVar27 / 8) * 8;
      iVar28 = (iVar27 % 8) / 4;
      for (local_9c4 = 0; local_9c4 < iVar28; local_9c4 = local_9c4 + 1) {
        iVar20 = local_9f4 + local_9c4 * 4;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        uVar12 = *puVar24;
        uVar13 = puVar24[1];
        puVar24 = (undefined8 *)((long)pvVar8 + (long)iVar20 * 4);
        uVar14 = *puVar24;
        uVar15 = puVar24[1];
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        local_410 = (float)uVar12;
        fStack_40c = (float)((ulong)uVar12 >> 0x20);
        fStack_408 = (float)uVar13;
        fStack_404 = (float)((ulong)uVar13 >> 0x20);
        local_420 = (float)uVar14;
        fStack_41c = (float)((ulong)uVar14 >> 0x20);
        fStack_418 = (float)uVar15;
        fStack_414 = (float)((ulong)uVar15 >> 0x20);
        *puVar24 = CONCAT44(fStack_40c * fStack_41c,local_410 * local_420);
        puVar24[1] = CONCAT44(fStack_404 * fStack_414,fStack_408 * fStack_418);
      }
      for (local_9f4 = iVar28 * 4 + local_9f4; local_9f4 < iVar27; local_9f4 = local_9f4 + 1) {
        *(float *)((long)pvVar10 + (long)local_9f4 * 4) =
             *(float *)((long)pvVar10 + (long)local_9f4 * 4) *
             *(float *)((long)pvVar8 + (long)local_9f4 * 4);
      }
    }
    else {
      for (local_8b0 = 0; local_8b0 < iVar27 / 8; local_8b0 = local_8b0 + 1) {
        iVar28 = local_8b0 * 8;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar28 * 4);
        auVar11 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar8 + (long)iVar28 * 4),
                                  *(undefined1 (*) [32])((long)pvVar10 + (long)iVar28 * 4),
                                  *(undefined1 (*) [32])(lVar9 + (long)iVar28 * 4));
        local_680 = auVar11._0_8_;
        uStack_678 = auVar11._8_8_;
        *puVar24 = local_680;
        puVar24[1] = uStack_678;
        puVar24[2] = 0;
        puVar24[3] = 0;
      }
      local_964 = (iVar27 / 8) * 8;
      iVar28 = (iVar27 % 8) / 4;
      for (local_924 = 0; local_924 < iVar28; local_924 = local_924 + 1) {
        iVar20 = local_964 + local_924 * 4;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        auVar11 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar8 + (long)iVar20 * 4),
                                  *(undefined1 (*) [16])((long)pvVar10 + (long)iVar20 * 4),
                                  *(undefined1 (*) [16])(lVar9 + (long)iVar20 * 4));
        local_580 = auVar11._0_8_;
        uStack_578 = auVar11._8_8_;
        *puVar24 = local_580;
        puVar24[1] = uStack_578;
      }
      for (local_964 = iVar28 * 4 + local_964; local_964 < iVar27; local_964 = local_964 + 1) {
        *(float *)((long)pvVar10 + (long)local_964 * 4) =
             *(float *)((long)pvVar10 + (long)local_964 * 4) *
             *(float *)((long)pvVar8 + (long)local_964 * 4) +
             *(float *)(lVar9 + (long)local_964 * 4);
      }
    }
  }
  if (iVar6 == 2) {
    iVar27 = iVar21 * iVar7;
    for (local_9fc = 0; local_9fc < iVar3; local_9fc = local_9fc + 1) {
      local_a08 = (undefined1 (*) [32])
                  ((long)pvVar22->data + (long)pvVar22->w * (long)local_9fc * pvVar22->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_9fc * 4);
      if (iVar7 == 4) {
        puVar24 = (undefined8 *)((long)pvVar8 + (long)(local_9fc << 2) * 4);
        local_cb0 = *puVar24;
        uStack_ca8 = puVar24[1];
      }
      else {
        local_cb0 = CONCAT44(fVar1,fVar1);
        uStack_ca8 = CONCAT44(fVar1,fVar1);
      }
      if (iVar7 == 8) {
        local_ce0 = *(undefined1 (*) [32])((long)pvVar8 + (long)(local_9fc << 3) * 4);
      }
      else {
        local_ce0._8_8_ = uStack_ca8;
        local_ce0._0_8_ = local_cb0;
        local_ce0._24_8_ = uStack_ca8;
        local_ce0._16_8_ = local_cb0;
      }
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_ad4 = 0; local_ad4 + 7 < iVar27; local_ad4 = local_ad4 + 8) {
          auVar16 = *(undefined1 (*) [24])*local_a08;
          local_4c0 = auVar16._0_4_;
          fStack_4bc = auVar16._4_4_;
          fStack_4b8 = auVar16._8_4_;
          fStack_4b4 = auVar16._12_4_;
          fStack_4b0 = auVar16._16_4_;
          fStack_4ac = auVar16._20_4_;
          fStack_4a8 = (float)*(undefined8 *)(*local_a08 + 0x18);
          uStack_4a4 = (undefined4)((ulong)*(undefined8 *)(*local_a08 + 0x18) >> 0x20);
          local_4e0 = local_ce0._0_4_;
          fStack_4dc = local_ce0._4_4_;
          fStack_4d8 = local_ce0._8_4_;
          fStack_4d4 = local_ce0._12_4_;
          fStack_4d0 = local_ce0._16_4_;
          fStack_4cc = local_ce0._20_4_;
          fStack_4c8 = local_ce0._24_4_;
          *(ulong *)*local_a08 = CONCAT44(fStack_4bc * fStack_4dc,local_4c0 * local_4e0);
          *(ulong *)(*local_a08 + 8) = CONCAT44(fStack_4b4 * fStack_4d4,fStack_4b8 * fStack_4d8);
          *(ulong *)(*local_a08 + 0x10) = CONCAT44(fStack_4ac * fStack_4cc,fStack_4b0 * fStack_4d0);
          *(ulong *)(*local_a08 + 0x18) = CONCAT44(uStack_4a4,fStack_4a8 * fStack_4c8);
          local_a08 = local_a08 + 1;
        }
        for (; local_ad4 + 3 < iVar27; local_ad4 = local_ad4 + 4) {
          local_430 = (float)*(undefined8 *)*local_a08;
          fStack_42c = (float)((ulong)*(undefined8 *)*local_a08 >> 0x20);
          fStack_428 = (float)*(undefined8 *)(*local_a08 + 8);
          fStack_424 = (float)((ulong)*(undefined8 *)(*local_a08 + 8) >> 0x20);
          local_440 = (float)local_cb0;
          fStack_43c = (float)((ulong)local_cb0 >> 0x20);
          fStack_438 = (float)uStack_ca8;
          fStack_434 = (float)((ulong)uStack_ca8 >> 0x20);
          *(ulong *)*local_a08 = CONCAT44(fStack_42c * fStack_43c,local_430 * local_440);
          *(ulong *)(*local_a08 + 8) = CONCAT44(fStack_424 * fStack_434,fStack_428 * fStack_438);
          local_a08 = (undefined1 (*) [32])(*local_a08 + 0x10);
        }
        for (; local_ad4 < iVar27; local_ad4 = local_ad4 + 1) {
          *(float *)*local_a08 = *(float *)*local_a08 * fVar1;
          local_a08 = (undefined1 (*) [32])(*local_a08 + 4);
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_9fc * 4);
        if (iVar7 == 4) {
          puVar24 = (undefined8 *)(lVar9 + (long)(local_9fc << 2) * 4);
          local_cf0 = *puVar24;
          uStack_ce8 = puVar24[1];
        }
        else {
          local_cf0 = CONCAT44(fVar2,fVar2);
          uStack_ce8 = CONCAT44(fVar2,fVar2);
        }
        if (iVar7 == 8) {
          local_d20 = *(undefined1 (*) [32])(lVar9 + (long)(local_9fc << 3) * 4);
        }
        else {
          local_d20._8_8_ = uStack_ce8;
          local_d20._0_8_ = local_cf0;
          local_d20._24_8_ = uStack_ce8;
          local_d20._16_8_ = local_cf0;
        }
        for (local_a84 = 0; local_a84 + 7 < iVar27; local_a84 = local_a84 + 8) {
          auVar11 = vfmadd213ps_fma(local_ce0,*local_a08,local_d20);
          local_700 = auVar11._0_8_;
          uStack_6f8 = auVar11._8_8_;
          *(undefined8 *)*local_a08 = local_700;
          *(undefined8 *)(*local_a08 + 8) = uStack_6f8;
          *(undefined8 *)(*local_a08 + 0x10) = 0;
          *(undefined8 *)(*local_a08 + 0x18) = 0;
          local_a08 = local_a08 + 1;
        }
        for (; local_a84 + 3 < iVar27; local_a84 = local_a84 + 4) {
          auVar19._8_8_ = uStack_ca8;
          auVar19._0_8_ = local_cb0;
          auVar11._8_8_ = uStack_ce8;
          auVar11._0_8_ = local_cf0;
          auVar11 = vfmadd213ps_fma(auVar19,*(undefined1 (*) [16])*local_a08,auVar11);
          local_2d0 = auVar11._0_8_;
          uStack_2c8 = auVar11._8_8_;
          *(undefined8 *)*local_a08 = local_2d0;
          *(undefined8 *)(*local_a08 + 8) = uStack_2c8;
          local_a08 = (undefined1 (*) [32])(*local_a08 + 0x10);
        }
        for (; local_a84 < iVar27; local_a84 = local_a84 + 1) {
          *(float *)*local_a08 = *(float *)*local_a08 * fVar1 + fVar2;
          local_a08 = (undefined1 (*) [32])(*local_a08 + 4);
        }
      }
    }
  }
  if ((iVar6 == 3) || (iVar6 == 4)) {
    iVar21 = iVar21 * iVar3 * iVar4 * iVar7;
    for (local_b18 = 0; local_b18 < iVar5; local_b18 = local_b18 + 1) {
      local_b20 = (undefined1 (*) [32])
                  ((long)pvVar22->data + pvVar22->cstep * (long)local_b18 * pvVar22->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_b18 * 4);
      if (iVar7 == 4) {
        puVar24 = (undefined8 *)((long)pvVar8 + (long)(local_b18 << 2) * 4);
        local_d60 = *puVar24;
        uStack_d58 = puVar24[1];
      }
      else {
        local_d60 = CONCAT44(fVar1,fVar1);
        uStack_d58 = CONCAT44(fVar1,fVar1);
      }
      if (iVar7 == 8) {
        local_d80 = *(undefined1 (*) [32])((long)pvVar8 + (long)(local_b18 << 3) * 4);
      }
      else {
        local_d80._8_8_ = uStack_d58;
        local_d80._0_8_ = local_d60;
        local_d80._24_8_ = uStack_d58;
        local_d80._16_8_ = local_d60;
      }
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_c54 = 0; local_c54 + 7 < iVar21; local_c54 = local_c54 + 8) {
          auVar16 = *(undefined1 (*) [24])*local_b20;
          local_500 = auVar16._0_4_;
          fStack_4fc = auVar16._4_4_;
          fStack_4f8 = auVar16._8_4_;
          fStack_4f4 = auVar16._12_4_;
          fStack_4f0 = auVar16._16_4_;
          fStack_4ec = auVar16._20_4_;
          fStack_4e8 = (float)*(undefined8 *)(*local_b20 + 0x18);
          uStack_4e4 = (undefined4)((ulong)*(undefined8 *)(*local_b20 + 0x18) >> 0x20);
          local_520 = local_d80._0_4_;
          fStack_51c = local_d80._4_4_;
          fStack_518 = local_d80._8_4_;
          fStack_514 = local_d80._12_4_;
          fStack_510 = local_d80._16_4_;
          fStack_50c = local_d80._20_4_;
          fStack_508 = local_d80._24_4_;
          *(ulong *)*local_b20 = CONCAT44(fStack_4fc * fStack_51c,local_500 * local_520);
          *(ulong *)(*local_b20 + 8) = CONCAT44(fStack_4f4 * fStack_514,fStack_4f8 * fStack_518);
          *(ulong *)(*local_b20 + 0x10) = CONCAT44(fStack_4ec * fStack_50c,fStack_4f0 * fStack_510);
          *(ulong *)(*local_b20 + 0x18) = CONCAT44(uStack_4e4,fStack_4e8 * fStack_508);
          local_b20 = local_b20 + 1;
        }
        for (; local_c54 + 3 < iVar21; local_c54 = local_c54 + 4) {
          local_450 = (float)*(undefined8 *)*local_b20;
          fStack_44c = (float)((ulong)*(undefined8 *)*local_b20 >> 0x20);
          fStack_448 = (float)*(undefined8 *)(*local_b20 + 8);
          fStack_444 = (float)((ulong)*(undefined8 *)(*local_b20 + 8) >> 0x20);
          local_460 = (float)local_d60;
          fStack_45c = (float)((ulong)local_d60 >> 0x20);
          fStack_458 = (float)uStack_d58;
          fStack_454 = (float)((ulong)uStack_d58 >> 0x20);
          *(ulong *)*local_b20 = CONCAT44(fStack_44c * fStack_45c,local_450 * local_460);
          *(ulong *)(*local_b20 + 8) = CONCAT44(fStack_444 * fStack_454,fStack_448 * fStack_458);
          local_b20 = (undefined1 (*) [32])(*local_b20 + 0x10);
        }
        for (; local_c54 < iVar21; local_c54 = local_c54 + 1) {
          *(float *)*local_b20 = *(float *)*local_b20 * fVar1;
          local_b20 = (undefined1 (*) [32])(*local_b20 + 4);
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_b18 * 4);
        if (iVar7 == 4) {
          puVar24 = (undefined8 *)(lVar9 + (long)(local_b18 << 2) * 4);
          local_d90 = *puVar24;
          uStack_d88 = puVar24[1];
        }
        else {
          local_d90 = CONCAT44(fVar2,fVar2);
          uStack_d88 = CONCAT44(fVar2,fVar2);
        }
        if (iVar7 == 8) {
          local_dc0 = *(undefined1 (*) [32])(lVar9 + (long)(local_b18 << 3) * 4);
        }
        else {
          local_dc0._8_8_ = uStack_d88;
          local_dc0._0_8_ = local_d90;
          local_dc0._24_8_ = uStack_d88;
          local_dc0._16_8_ = local_d90;
        }
        for (local_c04 = 0; local_c04 + 7 < iVar21; local_c04 = local_c04 + 8) {
          auVar11 = vfmadd213ps_fma(local_d80,*local_b20,local_dc0);
          local_780 = auVar11._0_8_;
          uStack_778 = auVar11._8_8_;
          *(undefined8 *)*local_b20 = local_780;
          *(undefined8 *)(*local_b20 + 8) = uStack_778;
          *(undefined8 *)(*local_b20 + 0x10) = 0;
          *(undefined8 *)(*local_b20 + 0x18) = 0;
          local_b20 = local_b20 + 1;
        }
        for (; local_c04 + 3 < iVar21; local_c04 = local_c04 + 4) {
          auVar18._8_8_ = uStack_d58;
          auVar18._0_8_ = local_d60;
          auVar17._8_8_ = uStack_d88;
          auVar17._0_8_ = local_d90;
          auVar11 = vfmadd213ps_fma(auVar18,*(undefined1 (*) [16])*local_b20,auVar17);
          local_310 = auVar11._0_8_;
          uStack_308 = auVar11._8_8_;
          *(undefined8 *)*local_b20 = local_310;
          *(undefined8 *)(*local_b20 + 8) = uStack_308;
          local_b20 = (undefined1 (*) [32])(*local_b20 + 0x10);
        }
        for (; local_c04 < iVar21; local_c04 = local_c04 + 1) {
          *(float *)*local_b20 = *(float *)*local_b20 * fVar1 + fVar2;
          local_b20 = (undefined1 (*) [32])(*local_b20 + 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86_fma::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int dims = bottom_top_blob.dims;

    const int elempack = bottom_top_blob.elempack;

    const float* scale = scale_blob;
    const float* bias = bias_data;

    if (dims == 1)
    {
        float* ptr = (float*)bottom_top_blob;
        const int size = w * elempack;

        if (bias_term)
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                __m512 _bias512 = _mm512_loadu_ps(bias + i);
                _mm512_storeu_ps(ptr + i, _mm512_fmadd_ps(_p512, _s512, _bias512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                __m256 _bias256 = _mm256_loadu_ps(bias + i);
                _mm256_storeu_ps(ptr + i, _mm256_comp_fmadd_ps(_p256, _s256, _bias256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                __m128 _bias128 = _mm_loadu_ps(bias + i);
                _mm_store_ps(ptr + i, _mm_comp_fmadd_ps(_p128, _s128, _bias128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i] + bias[i];
            }
        }
        else
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                _mm512_storeu_ps(ptr + i, _mm512_mul_ps(_p512, _s512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                _mm256_storeu_ps(ptr + i, _mm256_mul_ps(_p256, _s256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                _mm_store_ps(ptr + i, _mm_mul_ps(_p128, _s128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i];
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = scale[i];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + i * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[i];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + i * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale[q];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + q * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[q];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + q * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    return 0;
}